

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long in_FS_OFFSET;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  JsonString jx;
  
  jx._128_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  jsonInit((JsonString *)&ctx_local,ctx);
  jsonAppendValue((JsonString *)&ctx_local,*argv);
  jsonResult((JsonString *)&ctx_local);
  sqlite3_result_subtype(ctx,0x4a);
  if (*(long *)(in_FS_OFFSET + 0x28) == jx._128_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}